

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer *__rhs;
  bool bVar1;
  uint uVar2;
  ThreadPool *this;
  char *pcVar3;
  uint uVar4;
  undefined1 local_140 [8];
  ThreadPool pool;
  ThreadPool *t;
  int local_38;
  allocator<char> local_31;
  
  signal(0xd,(__sighandler_t)0x1);
  std::thread::hardware_concurrency();
  if (argc < 3) {
    puts("usage benmark threadCount both|server|client clientcount packetSize");
    return 0;
  }
  pcVar3 = argv[2];
  uVar2 = atoi(argv[1]);
  local_38 = 0;
  if ((argc != 3) && (local_38 = atoi(argv[3]), 4 < (uint)argc)) {
    packetSize = atoi(argv[4]);
  }
  printf("threadCount:%d\n",(ulong)uVar2);
  hwnet::ThreadPool::ThreadPool((ThreadPool *)local_140);
  hwnet::ThreadPool::Init((ThreadPool *)local_140,1,0);
  bVar1 = hwnet::Poller::Init(&poller_,(ThreadPool *)local_140);
  if (!bVar1) {
    pcVar3 = "init failed";
    goto LAB_00117384;
  }
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  while (bVar1 = uVar4 != 0, uVar4 = uVar4 - 1, bVar1) {
    this = (ThreadPool *)operator_new(0xe0);
    hwnet::ThreadPool::ThreadPool(this);
    pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this;
    hwnet::ThreadPool::Init(this,1,1);
    std::vector<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>::push_back
              (&pools,(value_type *)
                      &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"both",&local_31);
  __rhs = &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__rhs);
  std::__cxx11::string::~string((string *)__rhs);
  if (bVar1) {
    server();
LAB_00117332:
    client(local_38);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"server",&local_31);
    bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__rhs);
    std::__cxx11::string::~string((string *)__rhs);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,"client",&local_31);
      bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__rhs);
      std::__cxx11::string::~string((string *)__rhs);
      if (!bVar1) {
        pcVar3 = "usage benmark threadCount both|server|client clientcount packetSize";
        goto LAB_00117384;
      }
      goto LAB_00117332;
    }
    server();
  }
  hwnet::Poller::Run(&poller_);
  pcVar3 = "program end";
LAB_00117384:
  puts(pcVar3);
  hwnet::ThreadPool::~ThreadPool((ThreadPool *)local_140);
  return 0;
}

Assistant:

int main(int argc,char **argv) {

	signal(SIGPIPE,SIG_IGN);

	auto count = 0;
	auto threadCount = std::thread::hardware_concurrency();

	auto mode = argv[2];

	if(argc < 3) {
		printf("usage benmark threadCount both|server|client clientcount packetSize\n");
		return 0;
	}

	threadCount = ::atoi(argv[1]);

	if(argc > 3) {
		count = ::atoi(argv[3]);
	}

	if(argc > 4) {
		packetSize = ::atoi(argv[4]);
	}

	printf("threadCount:%d\n",threadCount);
	
	ThreadPool pool;
	pool.Init(1);

	if(!poller_.Init(&pool)) {
		printf("init failed\n");
		return 0;
	}


	//每个pool只有一个线程，因此TCPSocket被绑定到单一线程上
	for(int i = 0; i < int(threadCount); i++) {
		ThreadPool *t = new ThreadPool();
		t->Init(1,ThreadPool::SwapMode);
		pools.push_back(t);
	}


	if(mode == std::string("both")) {
		server();
		client(count);
	} else if(mode == std::string("server")) {
		server();
	} else if(mode == std::string("client")) {
		client(count);
	} else {
		printf("usage benmark threadCount both|server|client clientcount packetSize\n");
		return 0;		
	}

	poller_.Run();

	printf("program end\n");

	return 0;
}